

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImU32 col;
  int iVar5;
  size_t __nmemb;
  uint uVar6;
  ImGuiTabBar *tab_bar_local;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  bVar1 = pIVar2->SkipItems;
  if (bVar1 == false) {
    tab_bar_local = tab_bar;
    if (((uint)flags >> 0x14 & 1) == 0) {
      ImVector<unsigned_int>::push_back(&pIVar2->IDStack,&tab_bar->ID);
    }
    ImVector<ImGuiTabBar_*>::push_back(&pIVar4->CurrentTabBar,&tab_bar_local);
    iVar5 = tab_bar_local->CurrFrameVisible;
    if (iVar5 != pIVar4->FrameCount) {
      if (((((flags & 1U) != 0) && ((tab_bar_local->Flags & 1) == 0)) &&
          (__nmemb = (size_t)(tab_bar_local->Tabs).Size, 1 < (long)__nmemb)) &&
         (tab_bar_local->PrevFrameVisible != -1)) {
        qsort((tab_bar_local->Tabs).Data,__nmemb,0x1c,TabItemComparerByVisibleOffset);
        iVar5 = tab_bar_local->CurrFrameVisible;
      }
      uVar6 = flags | 0x40;
      if ((flags & 0xc0U) != 0) {
        uVar6 = flags;
      }
      tab_bar_local->Flags = uVar6;
      IVar3 = tab_bar_bb->Max;
      (tab_bar_local->BarRect).Min = tab_bar_bb->Min;
      (tab_bar_local->BarRect).Max = IVar3;
      tab_bar_local->WantLayout = true;
      tab_bar_local->PrevFrameVisible = iVar5;
      tab_bar_local->CurrFrameVisible = pIVar4->FrameCount;
      local_40.y = (tab_bar_local->BarRect).Max.y - (tab_bar_local->BarRect).Min.y;
      local_40.x = tab_bar_local->OffsetMax;
      ItemSize(&local_40,0.0);
      (pIVar2->DC).CursorPos.x = (tab_bar_local->BarRect).Min.x;
      col = GetColorU32(uVar6 >> 0x15 & 2 | 0x21,1.0);
      local_40.x = (tab_bar_local->BarRect).Min.x;
      local_40.y = (tab_bar_local->BarRect).Max.y + -1.0;
      if ((uVar6 >> 0x15 & 1) == 0) {
        local_38.x = (pIVar2->WindowPadding).x;
        local_40.x = local_40.x - local_38.x;
      }
      else {
        local_38.x = 0.0;
      }
      local_38.x = local_38.x + (tab_bar_local->BarRect).Max.x;
      local_38.y = local_40.y;
      ImDrawList::AddLine(pIVar2->DrawList,&local_40,&local_38,col,1.0);
    }
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        window->IDStack.push_back(tab_bar->ID);

    g.CurrentTabBar.push_back(tab_bar);
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        //IMGUI_DEBUG_LOG("BeginTabBarEx already called this frame\n", g.FrameCount);
        IM_ASSERT(0);
        return true;
    }

    // When toggling back from ordered to manually-reorderable, shuffle tabs to enforce the last visible order. 
    // Otherwise, the most recently inserted tabs would move at the end of visible list which can be a little too confusing or magic for the user.
    if ((flags & ImGuiTabBarFlags_Reorderable) && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable) && tab_bar->Tabs.Size > 1 && tab_bar->PrevFrameVisible != -1)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByVisibleOffset);

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;

    // Layout    
    ItemSize(ImVec2(tab_bar->OffsetMax, tab_bar->BarRect.GetHeight()));
    window->DC.CursorPos.x = tab_bar->BarRect.Min.x;

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_Tab);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - ((flags & ImGuiTabBarFlags_DockNodeIsDockSpace) ? 0.0f : window->WindowPadding.x);
        const float separator_max_x = tab_bar->BarRect.Max.x + ((flags & ImGuiTabBarFlags_DockNodeIsDockSpace) ? 0.0f : window->WindowPadding.x);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}